

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall Tree::BuildVirtualFolder(Tree *this,cmXMLWriter *xml)

{
  pointer pTVar1;
  cmXMLWriter *this_00;
  pointer this_01;
  string virtualFolders;
  allocator<char> local_79;
  string local_78;
  cmXMLWriter *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Option",(allocator<char> *)&local_50);
  local_58 = xml;
  cmXMLWriter::StartElement(xml,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMake Files\\;",(allocator<char> *)&local_50);
  pTVar1 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 = local_58, this_01 != pTVar1;
      this_01 = this_01 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_79);
    BuildVirtualFolderImpl(this_01,&local_78,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(local_58,"virtualFolders",&local_78);
  cmXMLWriter::EndElement(this_00);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Tree::BuildVirtualFolder(cmXMLWriter& xml) const
{
  xml.StartElement("Option");
  std::string virtualFolders = "CMake Files\\;";
  for (Tree const& folder : this->folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, "");
  }
  xml.Attribute("virtualFolders", virtualFolders);
  xml.EndElement();
}